

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  __type _Var1;
  ostream *poVar2;
  const_iterator it;
  pointer piVar3;
  initializer_list<int> __l;
  allocator local_209;
  vector<int,_std::allocator<int>_> test;
  allocator_type local_1f0 [32];
  string expectedString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream oss;
  
  _oss = 0x300000001;
  __l._M_len = 3;
  __l._M_array = (iterator)&oss;
  std::vector<int,_std::allocator<int>_>::vector(&test,__l,local_1f0);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test mkString...");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::string((string *)&expectedString,"1 3 34",(allocator *)&oss);
  std::__cxx11::string::string((string *)local_1f0,"",&local_209);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss,(string *)local_1f0,_S_out);
  std::__cxx11::string::~string((string *)local_1f0);
  if (test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)
  {
    for (piVar3 = test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start;
        piVar3 != test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_finish; piVar3 = piVar3 + 1) {
      if (piVar3 != test.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        std::operator<<((ostream *)&oss," ");
      }
      std::ostream::operator<<((ostream *)&oss,*piVar3);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  _Var1 = std::operator==(&expectedString,&local_1b0);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_1b0);
    poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&expectedString);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&test.super__Vector_base<int,_std::allocator<int>_>);
    return 0;
  }
  __assert_fail("expectedString==Functional::mkString(test)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/mkString/main.cpp"
                ,0x12,"int main()");
}

Assistant:

int main(){

    
  
  vector<int> test={1, 3, 34};
  
  cout << "Test mkString..." << endl;
  string expectedString="1 3 34";
  assert(expectedString==Functional::mkString(test));
  cout << "passed!" << endl;
  
  return 0;

}